

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_markov_node.cpp
# Opt level: O1

void __thiscall gauss_markov_node::update(gauss_markov_node *this,double time)

{
  vec3 *pvVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = (this->super_node).x;
  iVar2 = 1;
  dVar4 = XMIN;
  if (dVar3 <= XMIN) {
LAB_00103d62:
    (this->super_node).x = (dVar4 + dVar4) - dVar3;
    reflect(this,iVar2);
  }
  else {
    iVar2 = 2;
    dVar4 = XMAX;
    if (XMAX <= dVar3) goto LAB_00103d62;
  }
  dVar3 = (this->super_node).y;
  iVar2 = 3;
  dVar4 = YMIN;
  if (dVar3 <= YMIN) {
LAB_00103da7:
    (this->super_node).y = (dVar4 + dVar4) - dVar3;
    reflect(this,iVar2);
  }
  else {
    iVar2 = 4;
    dVar4 = YMAX;
    if (YMAX <= dVar3) goto LAB_00103da7;
  }
  dVar3 = (this->super_node).z;
  iVar2 = 5;
  dVar4 = ZMIN;
  if (ZMIN < dVar3) {
    iVar2 = 6;
    dVar4 = ZMAX;
    if (dVar3 < ZMAX) goto LAB_00103e02;
  }
  (this->super_node).z = (dVar4 + dVar4) - dVar3;
  reflect(this,iVar2);
LAB_00103e02:
  dVar3 = node::getv(&this->super_node);
  dVar4 = node::getd(&this->super_node);
  dVar4 = cos(dVar4);
  dVar5 = node::getp(&this->super_node);
  dVar5 = sin(dVar5);
  (this->super_node).x = dVar5 * dVar4 * dVar3 * time + (this->super_node).x;
  dVar3 = node::getv(&this->super_node);
  dVar4 = node::getd(&this->super_node);
  dVar4 = sin(dVar4);
  dVar5 = node::getp(&this->super_node);
  dVar5 = sin(dVar5);
  (this->super_node).y = dVar5 * dVar4 * dVar3 * time + (this->super_node).y;
  dVar3 = node::getv(&this->super_node);
  dVar4 = node::getp(&this->super_node);
  dVar4 = cos(dVar4);
  dVar4 = dVar4 * dVar3 * time + (this->super_node).z;
  (this->super_node).z = dVar4;
  pvVar1 = points;
  dVar3 = (this->super_node).y;
  iVar2 = (this->super_node).id;
  points[iVar2].field_0.x = (float)(this->super_node).x;
  pvVar1[iVar2].field_1.y = (float)dVar3;
  pvVar1[iVar2].field_2.z = (float)dVar4;
  node::calc(&this->super_node,(this->super_node).id,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  return;
}

Assistant:

void gauss_markov_node::update(double time){   //parameter time is in second
    if (this->x <= XMIN) {      //If gauss_markov_node hit the XMIN bound then reflect
        this->x = 2*XMIN - this->x;     //Fix out of bound bug: if OutOfBound then mirror
        reflect(1);
    }else if(this->x >= XMAX){  //If gauss_markov_node hit the XMAX bound then reflect
        this->x = 2*XMAX - this->x;
        reflect(2);
    }
    if (this->y <= YMIN) {
        this->y = 2*YMIN - this->y;
        reflect(3);
    } else if(this->y >= YMAX){
        this->y = 2*YMAX - this->y;
        reflect(4);
    }
    if (this->z <=ZMIN){
        this->z = 2*ZMIN - this->z;
        reflect(5);
    }else if(this->z >= ZMAX){
        this->z = 2*ZMAX - this->z;
        reflect(6);
    }
//    if(this->x >= (XMAX-xbuffer)){
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.25*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.75*M_PI);
//        else this->setdmean(M_PI);
//    }else if(this->x <= (XMIN+xbuffer)){
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.75*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.25*M_PI);
//        else this->setdmean(0);
//    }else {
//        if(this->y >= (YMAX-ybuffer)) this->setdmean(1.5*M_PI);
//        else if(this->y <= (YMIN+ybuffer)) this->setdmean(0.5*M_PI);
//    }
    this->x += this->getv()*cos(this->getd())*sin(this->getp())*time;
    this->y += this->getv()*sin(this->getd())*sin(this->getp())*time;
    this->z += this->getv()*cos(this->getp())*time;
//    printf("ID=%d\t\tX=%f\t\tY=%f\t\tZ=%f\n",this->id,this->x,this->y,this->z);
    points[this->id] = glm::vec3(this->x, this->y, this->z);
    calc(this->id, this->x, this->y, this->z);    //这句是将xyz转换为wgs84坐标系
//    series->dataProxy()->resetArray(points);
}